

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

string * __thiscall
pbrt::FormattingScene::upgradeMaterialIndex
          (string *__return_storage_ptr__,FormattingScene *this,string *name,
          ParameterDictionary *dict,FileLoc loc)

{
  bool bVar1;
  ParameterDictionary *args;
  float *args_00;
  string local_b0;
  Float value;
  string local_88;
  vector<float,_std::allocator<float>_> index;
  string tex;
  
  args = dict;
  bVar1 = std::operator!=(name,"glass");
  if ((bVar1) && (bVar1 = std::operator!=(name,"uber"), bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&tex);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"index",(allocator<char> *)&local_88);
  ParameterDictionary::GetTexture(&tex,dict,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (tex._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"index",(allocator<char> *)&local_88);
    ParameterDictionary::GetFloatArray(&index,dict,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (index.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        index.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_b0);
    }
    else {
      args_00 = (float *)((long)index.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)index.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start);
      if (args_00 == (float *)0x4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"eta",(allocator<char> *)&value);
        ParameterDictionary::GetFloatArray
                  ((vector<float,_std::allocator<float>_> *)&local_88,dict,&local_b0);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&local_88);
        std::__cxx11::string::~string((string *)&local_b0);
        if (local_88._M_dataplus._M_p == (pointer)local_88._M_string_length) {
          value = *index.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,"index",(allocator<char> *)&local_88);
          ParameterDictionary::RemoveFloat(dict,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          indent_abi_cxx11_(&local_b0,this,1);
          StringPrintf<float&>(&local_88,(pbrt *)"\"float eta\" [ %f ]\n",(char *)&value,args_00);
          std::operator+(__return_storage_ptr__,&local_b0,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        else {
          (this->super_SceneRepresentation).errorExit = true;
          Error<std::__cxx11::string_const&>
                    (&loc,"Material \"%s\" has both \"index\" and \"eta\" parameters.",name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_b0);
        }
      }
      else {
        (this->super_SceneRepresentation).errorExit = true;
        Error(&loc,"Multiple values provided for \"index\" parameter.");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_b0);
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&index.super__Vector_base<float,_std::allocator<float>_>);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"eta",(allocator<char> *)&index);
    ParameterDictionary::GetTexture(&local_b0,dict,&local_88);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_88);
    if (local_b0._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"index",(allocator<char> *)&local_88);
      ParameterDictionary::RemoveTexture(dict,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      indent_abi_cxx11_(&local_b0,this,1);
      StringPrintf<std::__cxx11::string&>
                (&local_88,(pbrt *)"\"texture eta\" \"%s\"\n",(char *)&tex,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      std::operator+(__return_storage_ptr__,&local_b0,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      (this->super_SceneRepresentation).errorExit = true;
      Error<std::__cxx11::string_const&>
                (&loc,"Material \"%s\" has both \"index\" and \"eta\" parameters.",name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_b0);
    }
  }
  std::__cxx11::string::~string((string *)&tex);
  return __return_storage_ptr__;
}

Assistant:

std::string FormattingScene::upgradeMaterialIndex(const std::string &name,
                                                  ParameterDictionary *dict,
                                                  FileLoc loc) const {
    if (name != "glass" && name != "uber")
        return "";

    std::string tex = dict->GetTexture("index");
    if (!tex.empty()) {
        if (!dict->GetTexture("eta").empty()) {
            ErrorExitDeferred(
                &loc, R"(Material "%s" has both "index" and "eta" parameters.)", name);
            return "";
        }

        dict->RemoveTexture("index");
        return indent(1) + StringPrintf("\"texture eta\" \"%s\"\n", tex);
    } else {
        auto index = dict->GetFloatArray("index");
        if (index.empty())
            return "";
        if (index.size() != 1) {
            ErrorExitDeferred(&loc, "Multiple values provided for \"index\" parameter.");
            return "";
        }
        if (!dict->GetFloatArray("eta").empty()) {
            ErrorExitDeferred(
                &loc, R"(Material "%s" has both "index" and "eta" parameters.)", name);
            return "";
        }

        Float value = index[0];
        dict->RemoveFloat("index");
        return indent(1) + StringPrintf("\"float eta\" [ %f ]\n", value);
    }
}